

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

VirtualIterator<Kernel::Term_*>
Lib::getUniquePersistentIteratorFromPtr<Kernel::FirstOrderSubtermIt>(FirstOrderSubtermIt *it)

{
  uint uVar1;
  IteratorCore<Kernel::Term_*> *core;
  UniquePersistentIterator<Kernel::FirstOrderSubtermIt> *in_RSI;
  IteratorCore<Kernel::Term_*> *in_RDI;
  FirstOrderSubtermIt *in_stack_ffffffffffffffe8;
  
  uVar1 = (*(in_RSI->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore[2])();
  if ((uVar1 & 1) == 0) {
    VirtualIterator<Kernel::Term_*>::getEmpty();
  }
  else {
    core = (IteratorCore<Kernel::Term_*> *)::operator_new(0x20);
    UniquePersistentIterator<Kernel::FirstOrderSubtermIt>::UniquePersistentIterator
              (in_RSI,in_stack_ffffffffffffffe8);
    vi<Kernel::Term*>(core);
  }
  return (VirtualIterator<Kernel::Term_*>)in_RDI;
}

Assistant:

inline
VirtualIterator<ELEMENT_TYPE(Inner)> getUniquePersistentIteratorFromPtr(Inner* it)
{
  if(!it->hasNext()) {
    return VirtualIterator<ELEMENT_TYPE(Inner)>::getEmpty();
  }
  return vi( new UniquePersistentIterator<Inner>(*it) );
}